

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool kwssys::SystemTools::SplitProgramPath(string *in_name,string *dir,string *file,bool param_4)

{
  bool bVar1;
  byte bVar2;
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  string oldDir;
  size_type slashPos;
  string *in_stack_00001058;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  byte local_21;
  string *local_20;
  string *local_18;
  string *local_10;
  byte local_1;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::operator=(in_RSI,in_RDI);
  std::__cxx11::string::clear();
  ConvertToUnixSlashes(unaff_retaddr);
  bVar1 = FileIsDirectory(in_stack_00001058);
  if (!bVar1) {
    local_30 = std::__cxx11::string::rfind((char)local_18,0x2f);
    if (local_30 == -1) {
      std::__cxx11::string::operator=(local_20,local_18);
      std::__cxx11::string::clear();
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)local_18);
      std::__cxx11::string::operator=(local_20,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::resize((ulong)local_18);
    }
  }
  bVar2 = std::__cxx11::string::empty();
  if (((bVar2 & 1) != 0) || (bVar1 = FileIsDirectory(in_stack_00001058), bVar1)) {
    local_1 = 1;
  }
  else {
    std::__cxx11::string::string(local_70,local_10);
    ConvertToUnixSlashes(unaff_retaddr);
    std::__cxx11::string::operator=(local_18,local_10);
    local_1 = 0;
    std::__cxx11::string::~string(local_70);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SystemTools::SplitProgramPath(const std::string& in_name,
                                   std::string& dir, std::string& file, bool)
{
  dir = in_name;
  file.clear();
  SystemTools::ConvertToUnixSlashes(dir);

  if (!SystemTools::FileIsDirectory(dir)) {
    std::string::size_type slashPos = dir.rfind('/');
    if (slashPos != std::string::npos) {
      file = dir.substr(slashPos + 1);
      dir.resize(slashPos);
    } else {
      file = dir;
      dir.clear();
    }
  }
  if (!(dir.empty()) && !SystemTools::FileIsDirectory(dir)) {
    std::string oldDir = in_name;
    SystemTools::ConvertToUnixSlashes(oldDir);
    dir = in_name;
    return false;
  }
  return true;
}